

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

void __thiscall Fossilize::ExternalReplayer::Impl::parse_message(Impl *this,char *msg)

{
  int iVar1;
  long lVar2;
  _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *this_00;
  vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
  *this_01;
  pair<unsigned_int,_unsigned_long> local_30;
  char *end;
  
  iVar1 = strncmp(msg,"MODULE",6);
  if (iVar1 == 0) {
    local_30._0_8_ = strtoull(msg + 6,(char **)0x0,0x10);
    this_00 = (_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
               *)&this->faulty_spirv_modules;
  }
  else {
    iVar1 = strncmp(msg,"GRAPHICS_VERR",0xd);
    if (iVar1 == 0) {
      local_30._0_8_ = strtoull(msg + 0xd,(char **)0x0,0x10);
      this_00 = (_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                 *)&this->graphics_failed_validation;
    }
    else {
      iVar1 = strncmp(msg,"COMPUTE_VERR",0xc);
      if (iVar1 == 0) {
        local_30._0_8_ = strtoull(msg + 0xc,(char **)0x0,0x10);
        this_00 = (_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                   *)&this->compute_failed_validation;
      }
      else {
        iVar1 = strncmp(msg,"RAYTRACE_VERR",0xd);
        if (iVar1 != 0) {
          iVar1 = strncmp(msg,"GRAPHICS",8);
          if (iVar1 == 0) {
            end = (char *)0x0;
            lVar2 = strtol(msg + 8,&end,0);
            local_30.first = (uint)lVar2;
            if (end == (char *)0x0 || (int)local_30.first < 0) {
              return;
            }
            local_30.second = strtoull(end,(char **)0x0,0x10);
            this_01 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                       *)&this->faulty_graphics_pipelines;
          }
          else {
            iVar1 = strncmp(msg,"RAYTRACE",8);
            if (iVar1 == 0) {
              end = (char *)0x0;
              lVar2 = strtol(msg + 8,&end,0);
              local_30.first = (uint)lVar2;
              if (end == (char *)0x0 || (int)local_30.first < 0) {
                return;
              }
              local_30.second = strtoull(end,(char **)0x0,0x10);
              this_01 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                         *)&this->faulty_raytracing_pipelines;
            }
            else {
              iVar1 = strncmp(msg,"COMPUTE",7);
              if (iVar1 != 0) {
                return;
              }
              end = (char *)0x0;
              lVar2 = strtol(msg + 7,&end,0);
              local_30.first = (uint)lVar2;
              if (end == (char *)0x0 || (int)local_30.first < 0) {
                return;
              }
              local_30.second = strtoull(end,(char **)0x0,0x10);
              this_01 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                         *)&this->faulty_compute_pipelines;
            }
          }
          std::
          vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_int,unsigned_long>>(this_01,&local_30);
          return;
        }
        local_30._0_8_ = strtoull(msg + 0xd,(char **)0x0,0x10);
        this_00 = (_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                   *)&this->raytracing_failed_validation;
      }
    }
  }
  std::__detail::
  _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&local_30);
  return;
}

Assistant:

void ExternalReplayer::Impl::parse_message(const char *msg)
{
	if (strncmp(msg, "MODULE", 6) == 0)
	{
		auto hash = strtoull(msg + 6, nullptr, 16);
		faulty_spirv_modules.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		graphics_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "COMPUTE_VERR", 12) == 0)
	{
		auto hash = strtoull(msg + 12, nullptr, 16);
		compute_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "RAYTRACE_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		raytracing_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			faulty_graphics_pipelines.push_back({ unsigned(index), graphics_pipeline });
		}
	}
	else if (strncmp(msg, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash raytrace_pipeline = strtoull(end, nullptr, 16);
			faulty_raytracing_pipelines.push_back({ unsigned(index), raytrace_pipeline });
		}
	}
	else if (strncmp(msg, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 7, &end, 0));
		if (index >= 0 && end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			faulty_compute_pipelines.push_back({ unsigned(index), compute_pipeline });
		}
	}
}